

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPlateType::~IfcPlateType(IfcPlateType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  
  this_00 = (IfcTypeProduct *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  pvVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>).field_0x20 +
           *(long *)(*(long *)this + -0x18);
  *(undefined8 *)((long)pvVar1 + -0x1b0) = 0x9047a8;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x9048c0;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x9047d0;
  *(undefined8 *)((long)pvVar1 + -0x118) = 0x9047f8;
  *(undefined8 *)((long)pvVar1 + -0xc0) = 0x904820;
  *(undefined8 *)((long)pvVar1 + -0x68) = 0x904848;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x904870;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x904898;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x904b88;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x60 = 0x904c50;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x904bb0;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x904bd8;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x904c00;
  *(undefined8 *)&this_00->field_0x148 = 0x904c28;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__009048e8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcPlateType() : Object("IfcPlateType") {}